

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauEnum.c
# Opt level: O0

void Dau_EnumTestDump(Vec_Ptr_t *vSets,char *pFileName)

{
  int iVar1;
  FILE *__stream;
  Vec_Ptr_t *p;
  void *pvVar2;
  int local_38;
  uint local_34;
  int k;
  int v;
  char *pName;
  Vec_Ptr_t *vOne;
  FILE *pFile;
  char *pFileName_local;
  Vec_Ptr_t *vSets_local;
  
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    for (local_34 = 0; iVar1 = Vec_PtrSize(vSets), (int)local_34 < iVar1; local_34 = local_34 + 1) {
      p = (Vec_Ptr_t *)Vec_PtrEntry(vSets,local_34);
      fprintf(__stream,"VARIABLE NUMBER %d:\n",(ulong)local_34);
      for (local_38 = 0; iVar1 = Vec_PtrSize(p), local_38 < iVar1; local_38 = local_38 + 1) {
        pvVar2 = Vec_PtrEntry(p,local_38);
        fprintf(__stream,"%s\n",pvVar2);
      }
    }
    fclose(__stream);
  }
  return;
}

Assistant:

void Dau_EnumTestDump( Vec_Ptr_t * vSets, char * pFileName )
{ 
    FILE * pFile;
    Vec_Ptr_t * vOne;
    char * pName;
    int v, k;
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
        return;
    Vec_PtrForEachEntry( Vec_Ptr_t *, vSets, vOne, v )
    {
        fprintf( pFile, "VARIABLE NUMBER %d:\n", v );
        Vec_PtrForEachEntry( char *, vOne, pName, k )
            fprintf( pFile, "%s\n", pName );
    }
    fclose( pFile );
}